

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactorTimer.h
# Opt level: O0

void __thiscall
FactorTimer::reportFactorLevel1Clock(FactorTimer *this,HighsTimerClock *factor_timer_clock)

{
  vector<int,_std::allocator<int>_> *in_RDI;
  HighsTimerClock *unaff_retaddr;
  char *in_stack_00000008;
  FactorTimer *in_stack_00000010;
  vector<int,_std::allocator<int>_> factor_clock_list;
  vector<int,_std::allocator<int>_> *this_00;
  allocator_type *in_stack_ffffffffffffff88;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff90;
  initializer_list<int> in_stack_ffffffffffffff98;
  vector<int,_std::allocator<int>_> *__x;
  vector<int,_std::allocator<int>_> *this_01;
  
  __x = (vector<int,_std::allocator<int>_> *)0x200000001;
  this_01 = (vector<int,_std::allocator<int>_> *)0x400000003;
  this_00 = (vector<int,_std::allocator<int>_> *)&stack0xffffffffffffffa7;
  std::allocator<int>::allocator((allocator<int> *)0x7b93ae);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff98,in_stack_ffffffffffffff88);
  std::allocator<int>::~allocator((allocator<int> *)0x7b93d6);
  std::vector<int,_std::allocator<int>_>::vector(this_01,__x);
  reportFactorClockList(in_stack_00000010,in_stack_00000008,unaff_retaddr,in_RDI);
  std::vector<int,_std::allocator<int>_>::~vector(this_00);
  std::vector<int,_std::allocator<int>_>::~vector(this_00);
  return;
}

Assistant:

void reportFactorLevel1Clock(HighsTimerClock& factor_timer_clock) {
    std::vector<HighsInt> factor_clock_list{
        FactorInvertSimple, FactorInvertKernel, FactorInvertDeficient,
        FactorInvertFinish, FactorFtranLower,   FactorFtranUpper,
        FactorBtranLower,   FactorBtranUpper};
    reportFactorClockList("FactorLevel1", factor_timer_clock,
                          factor_clock_list);
  }